

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O1

void load_roller_data(birther *saved,birther *prev_player)

{
  int16_t iVar1;
  player *ppVar2;
  char *pcVar3;
  long lVar4;
  birther *pbVar5;
  byte bVar6;
  birther temp;
  birther local_68;
  
  bVar6 = 0;
  local_68.name[0x10] = '\0';
  local_68.name[0x11] = '\0';
  local_68.name[0x12] = '\0';
  local_68.name[0x13] = '\0';
  local_68.name[0x14] = '\0';
  local_68.name[0x15] = '\0';
  local_68.name[0x16] = '\0';
  local_68.name[0x17] = '\0';
  local_68.name[0x18] = '\0';
  local_68.name[0x19] = '\0';
  local_68.name[0x1a] = '\0';
  local_68.name[0x1b] = '\0';
  local_68.name[0x1c] = '\0';
  local_68.name[0x1d] = '\0';
  local_68.name[0x1e] = '\0';
  local_68.name[0x1f] = '\0';
  local_68.name[0] = '\0';
  local_68.name[1] = '\0';
  local_68.name[2] = '\0';
  local_68.name[3] = '\0';
  local_68.name[4] = '\0';
  local_68.name[5] = '\0';
  local_68.name[6] = '\0';
  local_68.name[7] = '\0';
  local_68.name[8] = '\0';
  local_68.name[9] = '\0';
  local_68.name[10] = '\0';
  local_68.name[0xb] = '\0';
  local_68.name[0xc] = '\0';
  local_68.name[0xd] = '\0';
  local_68.name[0xe] = '\0';
  local_68.name[0xf] = '\0';
  local_68.stat[2] = 0;
  local_68.stat[3] = 0;
  local_68.stat[4] = 0;
  local_68._38_2_ = 0;
  local_68.history = (char *)0x0;
  local_68.age = 0;
  local_68.wt = 0;
  local_68.ht = 0;
  local_68.sc = 0;
  local_68.au = 0;
  local_68.stat[0] = 0;
  local_68.stat[1] = 0;
  local_68.race = (player_race *)0x0;
  local_68.class = (player_class *)0x0;
  if (prev_player != (birther *)0x0) {
    save_roller_data(&local_68);
  }
  player->race = saved->race;
  ppVar2 = player;
  player->class = saved->class;
  ppVar2->age = saved->age;
  iVar1 = saved->wt;
  ppVar2->wt_birth = iVar1;
  ppVar2->wt = iVar1;
  iVar1 = saved->ht;
  ppVar2->ht_birth = iVar1;
  ppVar2->ht = iVar1;
  ppVar2->au_birth = saved->au;
  ppVar2->au = (uint)z_info->start_gold;
  lVar4 = 0;
  do {
    iVar1 = saved->stat[lVar4];
    ppVar2->stat_birth[lVar4] = iVar1;
    ppVar2->stat_cur[lVar4] = iVar1;
    ppVar2->stat_max[lVar4] = iVar1;
    ppVar2->stat_map[lVar4] = (int16_t)lVar4;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  if (ppVar2->history != (char *)0x0) {
    string_free(ppVar2->history);
  }
  pcVar3 = string_make(saved->history);
  ppVar2 = player;
  player->history = pcVar3;
  my_strcpy(ppVar2->full_name,saved->name,0x20);
  if (prev_player != (birther *)0x0) {
    if (prev_player->history != (char *)0x0) {
      string_free(prev_player->history);
    }
    pbVar5 = &local_68;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      prev_player->race = pbVar5->race;
      pbVar5 = (birther *)((long)pbVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      prev_player = (birther *)((long)prev_player + (ulong)bVar6 * -0x10 + 8);
    }
  }
  return;
}

Assistant:

static void load_roller_data(birther *saved, birther *prev_player)
{
	int i;

     /* The initialisation is just paranoia - structure assignment is
        (perhaps) not strictly defined to work with uninitialised parts
        of structures. */
	birther temp;
	memset(&temp, 0, sizeof(birther));

	/* Save the current data if we'll need it later */
	if (prev_player)
		save_roller_data(&temp);

	/* Load previous data */
	player->race     = saved->race;
	player->class    = saved->class;
	player->age      = saved->age;
	player->wt       = player->wt_birth = saved->wt;
	player->ht       = player->ht_birth = saved->ht;
	player->au_birth = saved->au;
	player->au       = z_info->start_gold;

	/* Load previous stats */
	for (i = 0; i < STAT_MAX; i++) {
		player->stat_max[i] = player->stat_cur[i] = player->stat_birth[i]
			= saved->stat[i];
		player->stat_map[i] = i;
	}

	/* Load previous history */
	if (player->history) {
		string_free(player->history);
	}
	player->history = string_make(saved->history);
	my_strcpy(player->full_name, saved->name, sizeof(player->full_name));

	/* Save the current data if the caller is interested in it. */
	if (prev_player) {
		if (prev_player->history) {
			string_free(prev_player->history);
		}
		*prev_player = temp;
	}
}